

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalName *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char __rhs;
  size_type sVar1;
  mapped_type *pmVar2;
  string mangled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  __lhs = name->name;
  __rhs = MangleField(name->type);
  std::operator+(&bStack_38,__lhs,__rhs);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->global_sym_map_,&bStack_38);
  if (sVar1 == 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->global_sym_map_,&bStack_38);
    WriteData(this,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("global_sym_map_.count(mangled) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x3bf,"void wabt::(anonymous namespace)::CWriter::Write(const GlobalName &)");
}

Assistant:

void CWriter::Write(const GlobalName& name) {
  std::string mangled = name.name + MangleField(name.type);
  assert(global_sym_map_.count(mangled) == 1);
  Write(global_sym_map_.at(mangled));
}